

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * doctest::toString(String *__return_storage_ptr__,longdouble in)

{
  size_type sVar1;
  string d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  ostringstream oss;
  undefined8 local_180 [2];
  uint auStack_170 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  *(undefined8 *)((long)local_180 + *(long *)(_oss + -0x18)) = 0xf;
  *(uint *)((long)auStack_170 + *(long *)(_oss + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(_oss + -0x18)) & 0xfffffefb | 4;
  std::ostream::_M_insert<long_double>(in);
  std::__cxx11::stringbuf::str();
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_not_of(&d,'0',0xffffffffffffffff);
  if ((sVar1 != 0xffffffffffffffff) && (sVar1 != d._M_string_length - 1)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_1a8,&d,0,sVar1 + (d._M_dataplus._M_p[sVar1] == '.') + 1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&d,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  String::String(__return_storage_ptr__,d._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&d);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

String toString(double long in) { return fpToString(in, 15); }